

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.cpp
# Opt level: O0

Ref<Lodtalk::ByteString> *
Lodtalk::ByteString::fromNative
          (Ref<Lodtalk::ByteString> *__return_storage_ptr__,VMContext *context,string *native)

{
  size_t indexableSize;
  ProtoObject *this;
  uint8_t *__dest;
  void *__src;
  size_t __n;
  ByteString *result;
  string *native_local;
  VMContext *context_local;
  
  indexableSize = std::__cxx11::string::size();
  this = (ProtoObject *)basicNativeNew(context,indexableSize);
  __dest = ProtoObject::getFirstFieldPointer(this);
  __src = (void *)std::__cxx11::string::data();
  __n = std::__cxx11::string::size();
  memcpy(__dest,__src,__n);
  Ref<Lodtalk::ByteString>::Ref(__return_storage_ptr__,context,(ByteString *)this);
  return __return_storage_ptr__;
}

Assistant:

Ref<ByteString> ByteString::fromNative(VMContext *context, const std::string &native)
{
	auto result = basicNativeNew(context, native.size());
	memcpy(result->getFirstFieldPointer(), native.data(), native.size());
	return Ref<ByteString> (context, reinterpret_cast<ByteString*> (result));
}